

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_function.hpp
# Opt level: O0

object boost::python::detail::
       make_function_aux<boost::python::detail::member<unsigned_long,HFParsingInfo>,boost::python::return_value_policy<boost::python::return_by_value,boost::python::default_call_policies>,boost::mpl::vector2<unsigned_long&,HFParsingInfo&>>
                 (member<unsigned_long,_HFParsingInfo> f,
                 return_value_policy<boost::python::return_by_value,_boost::python::default_call_policies>
                 *p,vector2<unsigned_long_&,_HFParsingInfo_&> *param_3)

{
  undefined8 in_RSI;
  object_base in_RDI;
  py_function *caller;
  py_function *in_stack_ffffffffffffffb0;
  caller<boost::python::detail::member<unsigned_long,_HFParsingInfo>,_boost::python::return_value_policy<boost::python::return_by_value,_boost::python::default_call_policies>,_boost::mpl::vector2<unsigned_long_&,_HFParsingInfo_&>_>
  local_30;
  py_function local_28 [5];
  
  caller<boost::python::detail::member<unsigned_long,_HFParsingInfo>,_boost::python::return_value_policy<boost::python::return_by_value,_boost::python::default_call_policies>,_boost::mpl::vector2<unsigned_long_&,_HFParsingInfo_&>_>
  ::caller(&local_30,in_RSI);
  caller = local_28;
  objects::py_function::
  py_function<boost::python::detail::caller<boost::python::detail::member<unsigned_long,HFParsingInfo>,boost::python::return_value_policy<boost::python::return_by_value,boost::python::default_call_policies>,boost::mpl::vector2<unsigned_long&,HFParsingInfo&>>>
            (in_stack_ffffffffffffffb0,
             (caller<boost::python::detail::member<unsigned_long,_HFParsingInfo>,_boost::python::return_value_policy<boost::python::return_by_value,_boost::python::default_call_policies>,_boost::mpl::vector2<unsigned_long_&,_HFParsingInfo_&>_>
              *)caller);
  objects::function_object((objects *)in_RDI.m_ptr,caller);
  objects::py_function::~py_function((py_function *)0x3c2762);
  return (object)(object_base)in_RDI.m_ptr;
}

Assistant:

object make_function_aux(
      F f                               // An object that can be invoked by detail::invoke()
      , CallPolicies const& p           // CallPolicies to use in the invocation
      , Sig const&                      // An MPL sequence of argument types expected by F
      )
  {
      return objects::function_object(
          detail::caller<F,CallPolicies,Sig>(f, p)
      );
  }